

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

bool VCXProjectWriter::outputFileConfig
               (OutputFilterData *d,XmlOutput *xml,XmlOutput *xmlFilter,QString *filename,
               QString *fullFilterName,bool fileAdded,bool hasCustomBuildStep)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  XmlOutput *this;
  xml_output *in_RSI;
  QString *in_RDI;
  byte in_R9B;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  VCFilter *filter;
  QString condition;
  undefined7 in_stack_fffffffffffff758;
  undefined1 in_stack_fffffffffffff75f;
  xml_output *in_stack_fffffffffffff760;
  QString *in_stack_fffffffffffff768;
  pchOption option;
  QStringList *in_stack_fffffffffffff770;
  xml_output *in_stack_fffffffffffff778;
  VCConfiguration *in_stack_fffffffffffff788;
  XmlOutput *in_stack_fffffffffffff798;
  xml_output *in_stack_fffffffffffff7a8;
  VCFilter *in_stack_fffffffffffff7b0;
  undefined1 local_829;
  byte local_7b2;
  byte local_7a1;
  bool local_769;
  QString *in_stack_fffffffffffff900;
  QString *in_stack_fffffffffffff908;
  XmlOutput *in_stack_fffffffffffff910;
  XmlOutput *in_stack_fffffffffffff918;
  undefined1 local_3b0 [264];
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined1 local_240 [24];
  undefined1 local_228 [24];
  undefined1 local_210 [24];
  undefined1 local_1f8 [448];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_769 = (bool)(in_R9B & 1);
  if (((byte)in_RDI[0x468] & 1) == 0) {
    if (((byte)in_RDI[0x448] & 1) != 0) {
      in_RDI[0x120] = (code)0x1;
    }
  }
  else if ((*(byte *)(*(long *)(in_RDI + 0x50) + 400) & 1) != 0) {
    QString::QString((QString *)in_stack_fffffffffffff760,
                     (QString *)CONCAT17(in_stack_fffffffffffff75f,in_stack_fffffffffffff758));
    VCFilter::modifyPCHstage(in_stack_fffffffffffff7b0,(QString *)in_stack_fffffffffffff7a8);
    QString::~QString((QString *)0x24bd8b);
  }
  bVar4 = false;
  local_7a1 = 1;
  if (((((in_stack_00000008 & 1) == 0) && (local_7a1 = 1, ((byte)in_RDI[0x78] & 1) == 0)) &&
      (local_7a1 = 1, ((byte)in_RDI[0x120] & 1) == 0)) &&
     (local_7a1 = 1, ((byte)in_RDI[0x468] & 1) != 0)) {
    QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
    bVar4 = true;
    local_7a1 = QString::startsWith(in_RDI,(CaseSensitivity)local_38);
  }
  if (bVar4) {
    QString::~QString((QString *)0x24be93);
  }
  if ((local_7a1 & 1) != 0) {
    if (((in_stack_00000008 & 1) != 0) || (((byte)in_RDI[0x78] & 1) != 0)) {
      if (local_769 == false) {
        local_769 = true;
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        tag((QString *)in_stack_fffffffffffff778);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        Option::fixPathToTargetOS
                  ((QString *)in_stack_fffffffffffff778,
                   SUB81((ulong)in_stack_fffffffffffff770 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff770 >> 0x30,0));
        attrTag(in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        attrTagS((char *)in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24bfed);
        QString::~QString((QString *)0x24bffa);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24c014);
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        tag((QString *)in_stack_fffffffffffff778);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        Option::fixPathToTargetOS
                  ((QString *)in_stack_fffffffffffff778,
                   SUB81((ulong)in_stack_fffffffffffff770 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff770 >> 0x30,0));
        attrTag(in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24c0e6);
        QString::~QString((QString *)0x24c0f3);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24c10d);
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        bVar3 = QString::startsWith(in_RDI,(CaseSensitivity)local_1f8);
        bVar2 = false;
        bVar1 = false;
        bVar4 = false;
        local_7b2 = 1;
        if ((bVar3 & 1) == 0) {
          QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
          bVar2 = true;
          bVar3 = QString::startsWith(in_RDI,(CaseSensitivity)local_210);
          local_7b2 = 1;
          if ((bVar3 & 1) == 0) {
            QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
            bVar1 = true;
            bVar3 = QString::startsWith(in_RDI,(CaseSensitivity)local_228);
            local_7b2 = 1;
            if ((bVar3 & 1) == 0) {
              QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
              bVar4 = true;
              local_7b2 = QString::startsWith(in_RDI,(CaseSensitivity)local_240);
            }
          }
        }
        if (bVar4) {
          QString::~QString((QString *)0x24c29b);
        }
        if (bVar1) {
          QString::~QString((QString *)0x24c2b4);
        }
        if (bVar2) {
          QString::~QString((QString *)0x24c2cd);
        }
        QString::~QString((QString *)0x24c2da);
        if ((local_7b2 & 1) != 0) {
          QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
          attrTagS((char *)in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
          XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
          XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
          QString::~QString((QString *)0x24c356);
        }
      }
      (**(code **)(**(long **)(*(long *)(in_RDI + 0x50) + 0x198) + 0x40))
                (*(long **)(*(long *)(in_RDI + 0x50) + 0x198),in_RSI,in_RDI + 0x80);
    }
    if (local_769 == false) {
      local_769 = true;
      outputFileConfig(in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
                       ,in_stack_fffffffffffff900);
    }
    local_2a8 = 0xaaaaaaaaaaaaaaaa;
    local_2a0 = 0xaaaaaaaaaaaaaaaa;
    local_298 = 0xaaaaaaaaaaaaaaaa;
    generateCondition(in_stack_fffffffffffff788);
    if (((byte)in_RDI[0x468] & 1) == 0) {
      QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      tag((QString *)in_stack_fffffffffffff778);
      XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      attrTag(in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
      XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      valueTag((QString *)in_stack_fffffffffffff778);
      XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
      QString::~QString((QString *)0x24c516);
      XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
      QString::~QString((QString *)0x24c530);
      XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
      QString::~QString((QString *)0x24c54a);
    }
    QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
    uVar5 = QString::startsWith(in_RDI,(CaseSensitivity)local_3b0);
    local_829 = (code)0x0;
    if ((uVar5 & 1) != 0) {
      local_829 = in_RDI[0x468];
    }
    QString::~QString((QString *)0x24c5b8);
    if (((byte)local_829 & 1) != 0) {
      in_stack_fffffffffffff7a8 = in_RSI;
      QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      tag((QString *)in_stack_fffffffffffff778);
      in_stack_fffffffffffff7b0 =
           (VCFilter *)
           XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      attrTag(in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
      XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
      valueTag((QString *)in_stack_fffffffffffff778);
      XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
      QString::~QString((QString *)0x24c6af);
      XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
      QString::~QString((QString *)0x24c6c9);
      XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
      QString::~QString((QString *)0x24c6e3);
    }
    if (((byte)in_RDI[0x120] & 1) != 0) {
      bVar4 = QList<QString>::isEmpty((QList<QString> *)0x24c713);
      if (!bVar4) {
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        tag((QString *)in_stack_fffffffffffff778);
        in_stack_fffffffffffff798 =
             XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8)
        ;
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        attrTag(in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        valueTagX(in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24c813);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24c82d);
      }
      bVar4 = QString::isEmpty((QString *)0x24c848);
      if (!bVar4) {
        in_stack_fffffffffffff778 = in_RSI;
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        tag((QString *)in_stack_fffffffffffff778);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        attrTag(in_stack_fffffffffffff768,(QString *)in_stack_fffffffffffff760);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        valueTag((QString *)in_stack_fffffffffffff778);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24c941);
        XmlOutput::xml_output::~xml_output(in_stack_fffffffffffff760);
        QString::~QString((QString *)0x24c95b);
      }
      if (*(int *)(in_RDI + 0x390) != -1) {
        QString::QString(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff798);
        tag((QString *)in_stack_fffffffffffff778);
        this = XmlOutput::operator<<
                         ((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        QString::QString((QString *)this,(char *)in_stack_fffffffffffff798);
        attrTag((QString *)this,(QString *)in_RSI);
        option = (pchOption)((ulong)this >> 0x20);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        ::toString(option);
        valueTag((QString *)in_stack_fffffffffffff778);
        XmlOutput::operator<<((XmlOutput *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        XmlOutput::xml_output::~xml_output(in_RSI);
        QString::~QString((QString *)0x24ca61);
        XmlOutput::xml_output::~xml_output(in_RSI);
        QString::~QString((QString *)0x24ca7b);
        XmlOutput::xml_output::~xml_output(in_RSI);
        QString::~QString((QString *)0x24ca95);
      }
    }
    QString::~QString((QString *)0x24caa4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_769;
}

Assistant:

bool VCXProjectWriter::outputFileConfig(OutputFilterData *d, XmlOutput &xml, XmlOutput &xmlFilter,
                                        const QString &filename, const QString &fullFilterName,
                                        bool fileAdded, bool hasCustomBuildStep)
{
    VCFilter &filter = d->filter;
    if (d->inBuild) {
        if (filter.Project->usePCH)
            filter.modifyPCHstage(filename);
    } else {
        // Excluded files uses an empty compiler stage
        if (d->info.excludeFromBuild)
            filter.useCompilerTool = true;
    }

    // Actual XML output ----------------------------------
    if (hasCustomBuildStep || filter.useCustomBuildTool || filter.useCompilerTool
            || !d->inBuild || filter.Name.startsWith("Deployment Files")) {

        if (hasCustomBuildStep || filter.useCustomBuildTool)
        {
            if (!fileAdded) {
                fileAdded = true;

                xmlFilter << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename))
                    << attrTagS("Filter", fullFilterName);

                xml << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename));

                if (filter.Name.startsWith("Form Files")
                        || filter.Name.startsWith("Generated Files")
                        || filter.Name.startsWith("Resource Files")
                        || filter.Name.startsWith("Deployment Files"))
                    xml << attrTagS("FileType", "Document");
            }

            filter.Project->projectWriter->write(xml, filter.CustomBuildTool);
        }

        if (!fileAdded)
        {
            fileAdded = true;
            outputFileConfig(xml, xmlFilter, filename, fullFilterName);
        }

        const QString condition = generateCondition(*filter.Config);
        if (!d->inBuild) {
            xml << tag("ExcludedFromBuild")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.Name.startsWith("Deployment Files") && d->inBuild) {
            xml << tag("DeploymentContent")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.useCompilerTool) {

            if ( !filter.CompilerTool.ForcedIncludeFiles.isEmpty() ) {
                xml << tag("ForcedIncludeFiles")
                    << attrTag("Condition", condition)
                    << valueTagX(filter.CompilerTool.ForcedIncludeFiles);
            }

            if ( !filter.CompilerTool.PrecompiledHeaderThrough.isEmpty() ) {
                xml << tag("PrecompiledHeaderFile")
                    << attrTag("Condition", condition)
                    << valueTag(filter.CompilerTool.PrecompiledHeaderThrough);
            }

            if (filter.CompilerTool.UsePrecompiledHeader != pchUnset) {
                xml << tag("PrecompiledHeader")
                    << attrTag("Condition", condition)
                    << valueTag(toString(filter.CompilerTool.UsePrecompiledHeader));
            }
        }
    }

    return fileAdded;
}